

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::setSsl(QHttpNetworkRequest *this,bool s)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->ssl = s;
  return;
}

Assistant:

void QHttpNetworkRequest::setSsl(bool s)
{
    d->ssl = s;
}